

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O1

bool __thiscall
duckdb::LocalStorage::NextParallelScan
          (LocalStorage *this,ClientContext *context,DataTable *table,
          ParallelCollectionScanState *state,CollectionScanState *scan_state)

{
  bool bVar1;
  RowGroupCollection *this_00;
  optional_ptr<duckdb::LocalTableStorage,_true> storage;
  optional_ptr<duckdb::LocalTableStorage,_true> local_28;
  
  local_28 = LocalTableManager::GetStorage(&this->table_manager,table);
  if (local_28.ptr == (LocalTableStorage *)0x0) {
    bVar1 = false;
  }
  else {
    optional_ptr<duckdb::LocalTableStorage,_true>::CheckValid(&local_28);
    this_00 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&(local_28.ptr)->row_groups);
    bVar1 = RowGroupCollection::NextParallelScan(this_00,context,state,scan_state);
  }
  return bVar1;
}

Assistant:

bool LocalStorage::NextParallelScan(ClientContext &context, DataTable &table, ParallelCollectionScanState &state,
                                    CollectionScanState &scan_state) {
	auto storage = table_manager.GetStorage(table);
	if (!storage) {
		return false;
	}
	return storage->row_groups->NextParallelScan(context, state, scan_state);
}